

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O2

void __thiscall QCborStreamWriter::append(QCborStreamWriter *this,qfloat16 f)

{
  long in_FS_OFFSET;
  anon_union_2_1_ba1d3167_for_qfloat16_1 local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a = f.field_0;
  cbor_encode_floating_point
            (&((this->d)._M_t.
               super___uniq_ptr_impl<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QCborStreamWriterPrivate_*,_std::default_delete<QCborStreamWriterPrivate>_>
               .super__Head_base<0UL,_QCborStreamWriterPrivate_*,_false>._M_head_impl)->encoder,
             CborHalfFloatType,&local_a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCborStreamWriter::append(qfloat16 f)
{
    d->executeAppend(cbor_encode_half_float, static_cast<const void *>(&f));
}